

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O2

void lj_lib_register(lua_State *L,char *libname,uint8_t *p,lua_CFunction *cf)

{
  byte *str;
  byte bVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  char *pcVar5;
  GCproto *pt;
  GCfunc *pGVar6;
  GCstr *pGVar7;
  long lVar8;
  MSize nelems;
  byte *pbVar9;
  ulong uVar10;
  GCtab *t;
  TValue *pTVar11;
  uint uVar12;
  uint uVar13;
  uint8_t local_111;
  GCfunc *local_110;
  TValue *local_f8;
  GCtab *local_f0;
  LexState local_d8;
  
  uVar4 = (L->glref).ptr32;
  local_f0 = (GCtab *)(ulong)(L->env).gcptr32;
  local_111 = *p;
  bVar1 = p[1];
  bVar2 = p[2];
  if (libname == (char *)0x0) {
    lua_createtable(L,0,(uint)bVar2);
  }
  else {
    luaL_findtable(L,-10000,"_LOADED",0x10);
    lua_getfield(L,-1,libname);
    pTVar11 = L->top;
    if (*(int *)((long)pTVar11 + -4) != -0xc) {
      L->top = pTVar11 + -1;
      pcVar5 = luaL_findtable(L,-0x2712,libname,(uint)bVar2);
      if (pcVar5 != (char *)0x0) {
        lj_err_callerv(L,LJ_ERR_BADMODN,libname);
      }
      pTVar11 = L->top;
      (pTVar11->field_2).field_0 = pTVar11[-1].field_2.field_0;
      (pTVar11->field_2).it = 0xfffffff4;
      L->top = L->top + 1;
      lua_setfield(L,-3,libname);
      pTVar11 = L->top;
    }
    L->top = pTVar11 + -1;
    pTVar11[-2].field_2.field_0 = pTVar11[-1].field_2.field_0;
    *(undefined4 *)((long)pTVar11 + -0xc) = 0xfffffff4;
  }
  uVar12 = L->top[-1].u32.lo;
  t = (GCtab *)(ulong)uVar12;
  lVar8 = (long)L->top - (long)L->base;
  if ((t->marked & 4) != 0) {
    uVar10 = (ulong)(L->glref).ptr32;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr32 = *(uint32_t *)(uVar10 + 0x6c);
    *(uint *)(uVar10 + 0x6c) = uVar12;
  }
  uVar4 = uVar4 + (uint)bVar1 * 4 + 0x1480;
  t->nomm = '\0';
  local_110 = (GCfunc *)0x0;
  pbVar9 = p + 3;
  local_f8 = (TValue *)cf;
  do {
    while( true ) {
      str = pbVar9 + 1;
      bVar1 = *pbVar9;
      uVar13 = bVar1 & 0x3f;
      uVar12 = bVar1 & 0xffffffc0;
      if (uVar12 != 0xc0) break;
      switch(bVar1) {
      case 0xf9:
        bVar1 = pbVar9[1];
        pGVar7 = lj_str_new(L,(char *)(pbVar9 + 2),(ulong)bVar1);
        memset(&local_d8,0,0xa8);
        local_d8.p = (char *)(pbVar9 + (ulong)bVar1 + 2);
        local_d8.pe = (char *)0xffffffffffffffff;
        local_d8.c = -1;
        local_d8.level = 2;
        local_d8.L = L;
        local_d8.chunkname = pGVar7;
        pt = lj_bcread_proto(&local_d8);
        pt->firstline = -1;
        pGVar6 = lj_func_newL_empty(L,pt,(GCtab *)(ulong)(L->env).gcptr32);
        pTVar11 = lj_tab_setstr(L,t,pGVar7);
        (pTVar11->u32).lo = (uint32_t)pGVar6;
        (pTVar11->field_2).it = 0xfffffff7;
        pbVar9 = (byte *)local_d8.p;
        break;
      case 0xfa:
        pTVar11 = L->top;
        L->top = pTVar11 + -2;
        if ((*(int *)((long)pTVar11 + -4) == -5) && (*(int *)((ulong)pTVar11[-1].u32.lo + 0xc) == 0)
           ) {
          local_f0 = (GCtab *)(ulong)pTVar11[-2].u32.lo;
          pbVar9 = str;
        }
        else {
          pTVar11 = lj_tab_set(L,t,pTVar11 + -1);
          *pTVar11 = *L->top;
          pbVar9 = str;
        }
        break;
      case 0xfb:
        *L->top = *(TValue *)(pbVar9 + 1);
        L->top = L->top + 1;
        pbVar9 = pbVar9 + 9;
        break;
      case 0xfc:
        *L->top = L->top[-(ulong)pbVar9[1]];
        L->top = L->top + 1;
        pbVar9 = pbVar9 + 2;
        break;
      case 0xfd:
        pTVar11 = L->top;
        L->top = pTVar11 + 1;
        (pTVar11->u32).lo = (uint32_t)local_110;
        (pTVar11->field_2).it = 0xfffffff7;
        pbVar9 = str;
        break;
      case 0xfe:
        local_111 = local_111 + '\x01';
        pbVar9 = str;
        break;
      case 0xff:
        return;
      default:
        pTVar11 = L->top;
        L->top = pTVar11 + 1;
        pGVar7 = lj_str_new(L,(char *)str,(ulong)uVar13);
        (pTVar11->u32).lo = (uint32_t)pGVar7;
        (pTVar11->field_2).it = 0xfffffffb;
        pbVar9 = str + uVar13;
      }
    }
    uVar10 = ((ulong)((long)L->top - (long)L->base) >> 3) - (lVar8 >> 3);
    nelems = (MSize)uVar10;
    pGVar6 = lj_func_newC(L,nelems,local_f0);
    if (nelems != 0) {
      pTVar11 = (TValue *)((long)L->base + lVar8);
      L->top = pTVar11;
      memcpy((pGVar6->c).upvalue,pTVar11,(uVar10 & 0xffffffff) << 3);
    }
    (pGVar6->c).ffid = local_111;
    if ((bVar1 & 0xc0) == 0) {
      (pGVar6->c).pc.ptr32 = (L->glref).ptr32 + 0x180;
      uVar3 = uVar4;
LAB_00114fb0:
      pTVar11 = local_f8;
      local_f8 = local_f8 + 1;
      uVar4 = uVar3;
    }
    else {
      uVar3 = uVar4 + 4;
      (pGVar6->c).pc.ptr32 = uVar4;
      if (uVar12 != 0x80) goto LAB_00114fb0;
      pTVar11 = (TValue *)&(local_110->c).f;
      uVar4 = uVar3;
    }
    local_111 = local_111 + '\x01';
    (pGVar6->c).f = (lua_CFunction)*pTVar11;
    pbVar9 = str + uVar13;
    local_110 = pGVar6;
    if ((bVar1 & 0x3f) != 0) {
      pGVar7 = lj_str_new(L,(char *)str,(ulong)uVar13);
      pTVar11 = lj_tab_setstr(L,t,pGVar7);
      (pTVar11->u32).lo = (uint32_t)pGVar6;
      (pTVar11->field_2).it = 0xfffffff7;
    }
  } while( true );
}

Assistant:

void lj_lib_register(lua_State *L, const char *libname,
		     const uint8_t *p, const lua_CFunction *cf)
{
  GCtab *env = tabref(L->env);
  GCfunc *ofn = NULL;
  int ffid = *p++;
  BCIns *bcff = &L2GG(L)->bcff[*p++];
  GCtab *tab = lib_create_table(L, libname, *p++);
  ptrdiff_t tpos = L->top - L->base;

  /* Avoid barriers further down. */
  lj_gc_anybarriert(L, tab);
  tab->nomm = 0;

  for (;;) {
    uint32_t tag = *p++;
    MSize len = tag & LIBINIT_LENMASK;
    tag &= LIBINIT_TAGMASK;
    if (tag != LIBINIT_STRING) {
      const char *name;
      MSize nuv = (MSize)(L->top - L->base - tpos);
      GCfunc *fn = lj_func_newC(L, nuv, env);
      if (nuv) {
	L->top = L->base + tpos;
	memcpy(fn->c.upvalue, L->top, sizeof(TValue)*nuv);
      }
      fn->c.ffid = (uint8_t)(ffid++);
      name = (const char *)p;
      p += len;
      if (tag == LIBINIT_CF)
	setmref(fn->c.pc, &G(L)->bc_cfunc_int);
      else
	setmref(fn->c.pc, bcff++);
      if (tag == LIBINIT_ASM_)
	fn->c.f = ofn->c.f;  /* Copy handler from previous function. */
      else
	fn->c.f = *cf++;  /* Get cf or handler from C function table. */
      if (len) {
	/* NOBARRIER: See above for common barrier. */
	setfuncV(L, lj_tab_setstr(L, tab, lj_str_new(L, name, len)), fn);
      }
      ofn = fn;
    } else {
      switch (tag | len) {
      case LIBINIT_LUA:
	p = lib_read_lfunc(L, p, tab);
	break;
      case LIBINIT_SET:
	L->top -= 2;
	if (tvisstr(L->top+1) && strV(L->top+1)->len == 0)
	  env = tabV(L->top);
	else  /* NOBARRIER: See above for common barrier. */
	  copyTV(L, lj_tab_set(L, tab, L->top+1), L->top);
	break;
      case LIBINIT_NUMBER:
	memcpy(&L->top->n, p, sizeof(double));
	L->top++;
	p += sizeof(double);
	break;
      case LIBINIT_COPY:
	copyTV(L, L->top, L->top - *p++);
	L->top++;
	break;
      case LIBINIT_LASTCL:
	setfuncV(L, L->top++, ofn);
	break;
      case LIBINIT_FFID:
	ffid++;
	break;
      case LIBINIT_END:
	return;
      default:
	setstrV(L, L->top++, lj_str_new(L, (const char *)p, len));
	p += len;
	break;
      }
    }
  }
}